

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O0

pseudo_t add_binary_op(dmr_C *C,entrypoint *ep,symbol *ctype,int op,pseudo_t left,pseudo_t right)

{
  instruction *def;
  pseudo_t ppVar1;
  pseudo_t target;
  instruction *insn;
  pseudo_t right_local;
  pseudo_t left_local;
  int op_local;
  symbol *ctype_local;
  entrypoint *ep_local;
  dmr_C *C_local;
  
  def = alloc_typed_instruction(C,op,ctype);
  ppVar1 = dmrC_alloc_pseudo(C,def);
  (def->field_5).target = ppVar1;
  dmrC_use_pseudo(C,def,left,(pseudo_t *)&(def->field_6).field_0);
  dmrC_use_pseudo(C,def,right,&(def->field_6).field_6.src2);
  add_one_insn(C,ep,def);
  return ppVar1;
}

Assistant:

static pseudo_t add_binary_op(struct dmr_C *C, struct entrypoint *ep, struct symbol *ctype, int op, pseudo_t left, pseudo_t right)
{
	struct instruction *insn = alloc_typed_instruction(C, op, ctype);
	pseudo_t target = dmrC_alloc_pseudo(C, insn);
	insn->target = target;
	dmrC_use_pseudo(C, insn, left, &insn->src1);
	dmrC_use_pseudo(C, insn, right, &insn->src2);
	add_one_insn(C, ep, insn);
	return target;
}